

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O0

char * __thiscall Exception::what(Exception *this)

{
  char *pcVar1;
  allocator local_31;
  string local_30 [32];
  Exception *local_10;
  Exception *this_local;
  
  pcVar1 = this->err_msg;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  std::__cxx11::string::append(local_30);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return pcVar1;
}

Assistant:

const char* Exception::what() const throw(){
    return string(err_msg).append(err_word).c_str();
}